

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_transformation_compose_EXP
                    (matrix4 *self,vector3 *scale,quaternion *rotation,vector3 *translation)

{
  matrix4 *pmVar1;
  undefined1 local_a8 [8];
  matrix4 rotateM;
  matrix4 scaleM;
  vector3 *translation_local;
  quaternion *rotation_local;
  vector3 *scale_local;
  matrix4 *self_local;
  
  matrix4_identity(self);
  pmVar1 = matrix4_make_transformation_scalingv3((matrix4 *)((long)&rotateM.field_0 + 0x38),scale);
  matrix4_multiply(self,pmVar1);
  pmVar1 = matrix4_make_transformation_rotationq((matrix4 *)local_a8,rotation);
  matrix4_multiply(self,pmVar1);
  (self->field_0).m[3] = (translation->field_0).v[0];
  (self->field_0).m[7] = (translation->field_0).v[1];
  (self->field_0).m[0xb] = (translation->field_0).v[2];
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_transformation_compose_EXP(struct matrix4 *self, const struct vector3 *scale, const struct quaternion *rotation, const struct vector3 *translation)
{
	struct matrix4 scaleM, rotateM;

	matrix4_identity(self);

	/* scale */
	matrix4_multiply(self, matrix4_make_transformation_scalingv3(&scaleM, scale));

	/* rotate */
	matrix4_multiply(self, matrix4_make_transformation_rotationq(&rotateM, rotation));

	/* translate */
	self->c30 = translation->x;
	self->c31 = translation->y;
	self->c32 = translation->z;

	return self;
}